

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# machine_6502.cc
# Opt level: O3

void __thiscall testbench::machine_6502::initialize_CPU(machine_6502 *this)

{
  MOS6502 *pMVar1;
  int iVar2;
  
  machine_implementation::print_trace(&this->super_machine_implementation,"Initializing MOS6502\n");
  pMVar1 = (this->CPU_6502)._M_t.
           super___uniq_ptr_impl<chipemu::MOS6502,_std::default_delete<chipemu::MOS6502>_>._M_t.
           super__Tuple_impl<0UL,_chipemu::MOS6502_*,_std::default_delete<chipemu::MOS6502>_>.
           super__Head_base<0UL,_chipemu::MOS6502_*,_false>._M_head_impl;
  (**(code **)(*(long *)(pMVar1 + *(long *)(*(long *)pMVar1 + -0xd0)) + 0x40))
            (pMVar1 + *(long *)(*(long *)pMVar1 + -0xd0),0x28,0);
  pMVar1 = (this->CPU_6502)._M_t.
           super___uniq_ptr_impl<chipemu::MOS6502,_std::default_delete<chipemu::MOS6502>_>._M_t.
           super__Tuple_impl<0UL,_chipemu::MOS6502_*,_std::default_delete<chipemu::MOS6502>_>.
           super__Head_base<0UL,_chipemu::MOS6502_*,_false>._M_head_impl;
  (**(code **)(*(long *)(pMVar1 + *(long *)(*(long *)pMVar1 + -0x48)) + 0x20))
            (pMVar1 + *(long *)(*(long *)pMVar1 + -0x48));
  pMVar1 = (this->CPU_6502)._M_t.
           super___uniq_ptr_impl<chipemu::MOS6502,_std::default_delete<chipemu::MOS6502>_>._M_t.
           super__Tuple_impl<0UL,_chipemu::MOS6502_*,_std::default_delete<chipemu::MOS6502>_>.
           super__Head_base<0UL,_chipemu::MOS6502_*,_false>._M_head_impl;
  (**(code **)(*(long *)(pMVar1 + *(long *)(*(long *)pMVar1 + -0xd0)) + 0x40))
            (pMVar1 + *(long *)(*(long *)pMVar1 + -0xd0),0x25,1);
  pMVar1 = (this->CPU_6502)._M_t.
           super___uniq_ptr_impl<chipemu::MOS6502,_std::default_delete<chipemu::MOS6502>_>._M_t.
           super__Tuple_impl<0UL,_chipemu::MOS6502_*,_std::default_delete<chipemu::MOS6502>_>.
           super__Head_base<0UL,_chipemu::MOS6502_*,_false>._M_head_impl;
  (**(code **)(*(long *)(pMVar1 + *(long *)(*(long *)pMVar1 + -0x48)) + 0x20))
            (pMVar1 + *(long *)(*(long *)pMVar1 + -0x48));
  pMVar1 = (this->CPU_6502)._M_t.
           super___uniq_ptr_impl<chipemu::MOS6502,_std::default_delete<chipemu::MOS6502>_>._M_t.
           super__Tuple_impl<0UL,_chipemu::MOS6502_*,_std::default_delete<chipemu::MOS6502>_>.
           super__Head_base<0UL,_chipemu::MOS6502_*,_false>._M_head_impl;
  (**(code **)(*(long *)(pMVar1 + *(long *)(*(long *)pMVar1 + -0xd0)) + 0x40))
            (pMVar1 + *(long *)(*(long *)pMVar1 + -0xd0),2,1);
  pMVar1 = (this->CPU_6502)._M_t.
           super___uniq_ptr_impl<chipemu::MOS6502,_std::default_delete<chipemu::MOS6502>_>._M_t.
           super__Tuple_impl<0UL,_chipemu::MOS6502_*,_std::default_delete<chipemu::MOS6502>_>.
           super__Head_base<0UL,_chipemu::MOS6502_*,_false>._M_head_impl;
  (**(code **)(*(long *)(pMVar1 + *(long *)(*(long *)pMVar1 + -0x48)) + 0x20))
            (pMVar1 + *(long *)(*(long *)pMVar1 + -0x48));
  pMVar1 = (this->CPU_6502)._M_t.
           super___uniq_ptr_impl<chipemu::MOS6502,_std::default_delete<chipemu::MOS6502>_>._M_t.
           super__Tuple_impl<0UL,_chipemu::MOS6502_*,_std::default_delete<chipemu::MOS6502>_>.
           super__Head_base<0UL,_chipemu::MOS6502_*,_false>._M_head_impl;
  (**(code **)(*(long *)(pMVar1 + *(long *)(*(long *)pMVar1 + -0xd0)) + 0x40))
            (pMVar1 + *(long *)(*(long *)pMVar1 + -0xd0),0x26,0);
  pMVar1 = (this->CPU_6502)._M_t.
           super___uniq_ptr_impl<chipemu::MOS6502,_std::default_delete<chipemu::MOS6502>_>._M_t.
           super__Tuple_impl<0UL,_chipemu::MOS6502_*,_std::default_delete<chipemu::MOS6502>_>.
           super__Head_base<0UL,_chipemu::MOS6502_*,_false>._M_head_impl;
  (**(code **)(*(long *)(pMVar1 + *(long *)(*(long *)pMVar1 + -0x48)) + 0x20))
            (pMVar1 + *(long *)(*(long *)pMVar1 + -0x48));
  pMVar1 = (this->CPU_6502)._M_t.
           super___uniq_ptr_impl<chipemu::MOS6502,_std::default_delete<chipemu::MOS6502>_>._M_t.
           super__Tuple_impl<0UL,_chipemu::MOS6502_*,_std::default_delete<chipemu::MOS6502>_>.
           super__Head_base<0UL,_chipemu::MOS6502_*,_false>._M_head_impl;
  (**(code **)(*(long *)(pMVar1 + *(long *)(*(long *)pMVar1 + -0xd0)) + 0x40))
            (pMVar1 + *(long *)(*(long *)pMVar1 + -0xd0),4,1);
  pMVar1 = (this->CPU_6502)._M_t.
           super___uniq_ptr_impl<chipemu::MOS6502,_std::default_delete<chipemu::MOS6502>_>._M_t.
           super__Tuple_impl<0UL,_chipemu::MOS6502_*,_std::default_delete<chipemu::MOS6502>_>.
           super__Head_base<0UL,_chipemu::MOS6502_*,_false>._M_head_impl;
  (**(code **)(*(long *)(pMVar1 + *(long *)(*(long *)pMVar1 + -0x48)) + 0x20))
            (pMVar1 + *(long *)(*(long *)pMVar1 + -0x48));
  pMVar1 = (this->CPU_6502)._M_t.
           super___uniq_ptr_impl<chipemu::MOS6502,_std::default_delete<chipemu::MOS6502>_>._M_t.
           super__Tuple_impl<0UL,_chipemu::MOS6502_*,_std::default_delete<chipemu::MOS6502>_>.
           super__Head_base<0UL,_chipemu::MOS6502_*,_false>._M_head_impl;
  (**(code **)(*(long *)(pMVar1 + *(long *)(*(long *)pMVar1 + -0xd0)) + 0x40))
            (pMVar1 + *(long *)(*(long *)pMVar1 + -0xd0),6,1);
  pMVar1 = (this->CPU_6502)._M_t.
           super___uniq_ptr_impl<chipemu::MOS6502,_std::default_delete<chipemu::MOS6502>_>._M_t.
           super__Tuple_impl<0UL,_chipemu::MOS6502_*,_std::default_delete<chipemu::MOS6502>_>.
           super__Head_base<0UL,_chipemu::MOS6502_*,_false>._M_head_impl;
  (**(code **)(*(long *)(pMVar1 + *(long *)(*(long *)pMVar1 + -0x48)) + 0x18))
            (pMVar1 + *(long *)(*(long *)pMVar1 + -0x48));
  machine_implementation::print_trace
            (&this->super_machine_implementation,"Initializing MOS6502 - holding RES\n");
  iVar2 = 8;
  do {
    cycle((this->CPU_6502)._M_t.
          super___uniq_ptr_impl<chipemu::MOS6502,_std::default_delete<chipemu::MOS6502>_>._M_t.
          super__Tuple_impl<0UL,_chipemu::MOS6502_*,_std::default_delete<chipemu::MOS6502>_>.
          super__Head_base<0UL,_chipemu::MOS6502_*,_false>._M_head_impl);
    trace_CPU(this);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  pMVar1 = (this->CPU_6502)._M_t.
           super___uniq_ptr_impl<chipemu::MOS6502,_std::default_delete<chipemu::MOS6502>_>._M_t.
           super__Tuple_impl<0UL,_chipemu::MOS6502_*,_std::default_delete<chipemu::MOS6502>_>.
           super__Head_base<0UL,_chipemu::MOS6502_*,_false>._M_head_impl;
  (**(code **)(*(long *)(pMVar1 + *(long *)(*(long *)pMVar1 + -0xd0)) + 0x40))
            (pMVar1 + *(long *)(*(long *)pMVar1 + -0xd0),0x28,1);
  pMVar1 = (this->CPU_6502)._M_t.
           super___uniq_ptr_impl<chipemu::MOS6502,_std::default_delete<chipemu::MOS6502>_>._M_t.
           super__Tuple_impl<0UL,_chipemu::MOS6502_*,_std::default_delete<chipemu::MOS6502>_>.
           super__Head_base<0UL,_chipemu::MOS6502_*,_false>._M_head_impl;
  (**(code **)(*(long *)(pMVar1 + *(long *)(*(long *)pMVar1 + -0x48)) + 0x20))
            (pMVar1 + *(long *)(*(long *)pMVar1 + -0x48));
  machine_implementation::print_trace
            (&this->super_machine_implementation,"Initializing MOS6502 - done\n");
  return;
}

Assistant:

inline void machine_6502::initialize_CPU()
{
    print_trace("Initializing MOS6502\n");
    CPU_6502->pin_write(MOS6502::RES, false);              //  setup pins for
    CPU_6502->recalc();                                    //   starting the CPU_6502
    CPU_6502->pin_write(MOS6502::CLK0IN, true);            //   the order is important,
    CPU_6502->recalc();                                    //   
    CPU_6502->pin_write(MOS6502::RDY, true);
    CPU_6502->recalc();
    CPU_6502->pin_write(MOS6502::SO, false);
    CPU_6502->recalc();
    CPU_6502->pin_write(MOS6502::IRQ, true);
    CPU_6502->recalc();
    CPU_6502->pin_write(MOS6502::NMI, true);

    CPU_6502->stabilize_network();                         // compute initial states
                                                      //  of all nodes

    print_trace("Initializing MOS6502 - holding RES\n");
    for (int clk = 1; clk <= 8; ++clk) {
        cycle(CPU_6502.get());                        // hold reset for 8 cycles
        //handle_memory(CPU_6502.get(), &memory);
        trace_CPU();
    }

    CPU_6502->pin_write(MOS6502::RES, true);               // than let it go
    CPU_6502->recalc();

    print_trace("Initializing MOS6502 - done\n");
}